

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O2

int __thiscall
TPZSkylMatrix<std::complex<long_double>_>::PutVal
          (TPZSkylMatrix<std::complex<long_double>_> *this,int64_t r,int64_t c,
          complex<long_double> *value)

{
  complex<long_double> **ppcVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  long lVar5;
  complex<long_double> *pcVar6;
  ostream *poVar7;
  long lVar8;
  long lVar9;
  longdouble in_ST0;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  lVar9 = r - c;
  lVar5 = r;
  if (lVar9 == 0 || r < c) {
    lVar9 = -(r - c);
    lVar5 = c;
  }
  ppcVar1 = (this->fElem).fStore;
  pcVar6 = ppcVar1[lVar5];
  lVar8 = (long)ppcVar1[lVar5 + 1] - (long)pcVar6 >> 5;
  if (lVar8 <= lVar9) {
    local_48 = *(undefined8 *)value->_M_value;
    uStack_40 = *(undefined8 *)(value->_M_value + 8);
    local_38 = *(undefined8 *)(value->_M_value + 0x10);
    uStack_30 = *(undefined8 *)(value->_M_value + 0x18);
    std::abs<long_double>((longdouble *)&local_48,(complex<long_double> *)r);
    if ((longdouble)1e-16 <= ABS(in_ST0)) {
      poVar7 = std::operator<<((ostream *)&std::cout,"TPZSkylMatrix::PutVal Size");
      std::ostream::_M_insert<long>((long)poVar7);
      std::ostream::flush();
      TPZMatrix<std::complex<long_double>_>::Error
                ("virtual int TPZSkylMatrix<std::complex<long double>>::PutVal(const int64_t, const int64_t, const TVar &) [TVar = std::complex<long double>]"
                 ,"Index out of range");
      pcVar6 = (this->fElem).fStore[lVar5];
      goto LAB_00d55ebb;
    }
    ppcVar1 = (this->fElem).fStore;
    pcVar6 = ppcVar1[lVar5];
    lVar8 = (long)ppcVar1[lVar5 + 1] - (long)pcVar6 >> 5;
  }
  if (lVar8 <= lVar9) {
    return 1;
  }
LAB_00d55ebb:
  uVar2 = *(undefined8 *)value->_M_value;
  uVar3 = *(undefined8 *)(value->_M_value + 8);
  uVar4 = *(undefined8 *)(value->_M_value + 0x18);
  *(undefined8 *)(pcVar6[lVar9]._M_value + 0x10) = *(undefined8 *)(value->_M_value + 0x10);
  *(undefined8 *)((long)(pcVar6[lVar9]._M_value + 0x10) + 8) = uVar4;
  *(undefined8 *)pcVar6[lVar9]._M_value = uVar2;
  *(undefined8 *)(pcVar6[lVar9]._M_value + 8) = uVar3;
  (this->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fDecomposed = '\0';
  return 1;
}

Assistant:

int
TPZSkylMatrix<TVar>::PutVal(const int64_t r,const int64_t c,const TVar & value )
{
	// inicializando row e col para trabalhar com a triangular superior
	int64_t row(r),col(c);
	if ( row > col )
		this->Swap( &row, &col );
	
	// Indice do vetor coluna.
	int64_t index = col - row;
	// Se precisar redimensionar o vetor.
	//EBORIN: Do we really need to check this?
	if ( index >= Size(col) && !IsZero(value)) {
		cout << "TPZSkylMatrix::PutVal Size" << Size(col);
		cout.flush();
		TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__,"Index out of range");
	} else if(index >= Size(col)) return 1;
	fElem[col][index] = value;
	//  delete[]newVet;
	this->fDecomposed = 0;
	return( 1 );
}